

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O2

ILayoutPtr __thiscall cursespp::App::GetLayout(App *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  ILayoutPtr IVar1;
  
  std::__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x68));
  IVar1.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar1.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ILayoutPtr)IVar1.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ILayoutPtr App::GetLayout() {
    return this->state.layout;
}